

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

void lua_replace(lua_State *L,int idx)

{
  global_State *g;
  GCobj *o_00;
  int in_ESI;
  lua_State *in_RDI;
  TValue *o;
  GCfunc *fn;
  GCobj *in_stack_ffffffffffffffc8;
  global_State *in_stack_ffffffffffffffd0;
  
  if (in_ESI == -0x2712) {
    (in_RDI->env).gcptr32 = (uint32_t)in_RDI->top[-1].field_2.field_0;
  }
  else if (in_ESI == -0x2711) {
    g = (global_State *)(ulong)in_RDI->base[-1].u32.lo;
    if (*(char *)((long)&g->strhash + 5) != '\b') {
      lj_err_msg((lua_State *)g,(ErrMsg)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
    }
    g->strmask = (MSize)in_RDI->top[-1].field_2.field_0;
    if (((0xfffffff6 < *(int *)((long)in_RDI->top + -4) + 4U) &&
        ((*(byte *)((ulong)in_RDI->top[-1].u32.lo + 4) & 3) != 0)) &&
       (((ulong)g->strhash & 0x400000000) != 0)) {
      lj_gc_barrierf(g,in_stack_ffffffffffffffc8,(GCobj *)0x112cd3);
    }
  }
  else {
    o_00 = (GCobj *)index2adr(in_RDI,in_ESI);
    o_00->cd = (GCcdata)in_RDI->top[-1];
    if ((((in_ESI < -0x2712) && (0xfffffff6 < *(int *)((long)in_RDI->top + -4) + 4U)) &&
        ((*(byte *)((ulong)in_RDI->top[-1].u32.lo + 4) & 3) != 0)) &&
       ((*(byte *)((ulong)in_RDI->base[-1].u32.lo + 4) & 4) != 0)) {
      lj_gc_barrierf(in_stack_ffffffffffffffd0,o_00,(GCobj *)0x112d98);
    }
  }
  in_RDI->top = in_RDI->top + -1;
  return;
}

Assistant:

LUA_API void lua_replace(lua_State *L, int idx)
{
  api_checknelems(L, 1);
  if (idx == LUA_GLOBALSINDEX) {
    api_check(L, tvistab(L->top-1));
    /* NOBARRIER: A thread (i.e. L) is never black. */
    setgcref(L->env, obj2gco(tabV(L->top-1)));
  } else if (idx == LUA_ENVIRONINDEX) {
    GCfunc *fn = curr_func(L);
    if (fn->c.gct != ~LJ_TFUNC)
      lj_err_msg(L, LJ_ERR_NOENV);
    api_check(L, tvistab(L->top-1));
    setgcref(fn->c.env, obj2gco(tabV(L->top-1)));
    lj_gc_barrier(L, fn, L->top-1);
  } else {
    TValue *o = index2adr(L, idx);
    api_checkvalidindex(L, o);
    copyTV(L, o, L->top-1);
    if (idx < LUA_GLOBALSINDEX)  /* Need a barrier for upvalues. */
      lj_gc_barrier(L, curr_func(L), L->top-1);
  }
  L->top--;
}